

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainGoalPredictor.cpp
# Opt level: O0

pair<tiger::trains::world::IPost_*,_int> __thiscall
tiger::trains::ai::TrainGoalPredictor::predictGoal(TrainGoalPredictor *this,Train *train)

{
  IPost *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GoodType GVar6;
  World *pWVar7;
  reference ppPVar8;
  Line *pLVar9;
  mapped_type *pmVar10;
  pointer ppVar11;
  reference ppLVar12;
  reference ppIVar13;
  undefined4 extraout_var;
  Train *in_RSI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_const_tiger::trains::world::Point_*>_>,_bool>
  pVar14;
  pair<tiger::trains::world::IPost_*,_int> pVar15;
  IPost *post;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *__range2_1;
  IPost *minPost;
  Point *another;
  Line *line;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *__range3;
  Point *minPoint;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  setMinLen;
  int lenToEnd;
  Point *endPoint;
  int lenToStart;
  Point *startPoint;
  Point *point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *__range2;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  minLen;
  key_type *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  const_iterator in_stack_fffffffffffffca8;
  value_type *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcd8;
  mapped_type in_stack_fffffffffffffcdc;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  *in_stack_fffffffffffffce0;
  __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
  local_1a0;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *local_198;
  IPost *local_190;
  _Base_ptr local_188;
  undefined1 local_180;
  pair<int,_const_tiger::trains::world::Point_*> local_178;
  pair<int,_const_tiger::trains::world::Point_*> local_168;
  Point *local_158;
  Line *local_150;
  Line **local_148;
  __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  local_140;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *local_138;
  _Base_ptr local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  Point *local_118;
  _Base_ptr local_110;
  undefined1 local_108;
  pair<int,_const_tiger::trains::world::Point_*> local_100;
  _Base_ptr local_f0;
  undefined1 local_e8;
  pair<int,_const_tiger::trains::world::Point_*> local_e0 [4];
  int local_9c;
  Point *local_98;
  int local_8c;
  Point *local_88;
  Point *local_80;
  Point **local_78;
  __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
  local_70 [3];
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *local_58;
  Train *local_20;
  IPost *local_10;
  int local_8;
  
  local_20 = in_RSI;
  std::
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::map((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
         *)0x250224);
  pWVar7 = trains::world::Train::getWorld(local_20);
  local_58 = trains::world::World::getPointList(pWVar7);
  local_70[0]._M_current =
       (Point **)
       std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
       begin((vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
              *)in_stack_fffffffffffffc98);
  local_78 = (Point **)
             std::
             vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
             end((vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
                  *)in_stack_fffffffffffffc98);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                            (__normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
                             *)in_stack_fffffffffffffc98), bVar2) {
    ppPVar8 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
              ::operator*(local_70);
    local_80 = *ppPVar8;
    pmVar10 = std::
              map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
              ::operator[](in_stack_fffffffffffffce0,
                           (key_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                          );
    *pmVar10 = 0x7fffffff;
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
    ::operator++(local_70);
  }
  pLVar9 = trains::world::Train::getLine(local_20);
  local_88 = trains::world::Line::getStartPont(pLVar9);
  local_8c = trains::world::Train::getPosition(local_20);
  pLVar9 = trains::world::Train::getLine(local_20);
  local_98 = trains::world::Line::getEndPont(pLVar9);
  pLVar9 = trains::world::Train::getLine(local_20);
  iVar3 = trains::world::Line::getLenght(pLVar9);
  local_9c = trains::world::Train::getPosition(local_20);
  iVar5 = local_8c;
  local_9c = iVar3 - local_9c;
  pmVar10 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[](in_stack_fffffffffffffce0,
                         (key_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  iVar3 = local_9c;
  *pmVar10 = iVar5;
  pmVar10 = std::
            map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
            ::operator[](in_stack_fffffffffffffce0,
                         (key_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  *pmVar10 = iVar3;
  std::
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::set((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
         *)0x250497);
  std::pair<int,_const_tiger::trains::world::Point_*>::
  pair<int_&,_const_tiger::trains::world::Point_*&,_true>(local_e0,&local_8c,&local_88);
  pVar14 = std::
           set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
           ::insert((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                     *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcb8);
  local_f0 = (_Base_ptr)pVar14.first._M_node;
  local_e8 = pVar14.second;
  std::pair<int,_const_tiger::trains::world::Point_*>::
  pair<int_&,_const_tiger::trains::world::Point_*&,_true>(&local_100,&local_9c,&local_98);
  pVar14 = std::
           set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
           ::insert((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                     *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    in_stack_fffffffffffffcb8);
  local_110 = (_Base_ptr)pVar14.first._M_node;
  local_108 = pVar14.second;
  while (bVar2 = std::
                 set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                 ::empty((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                          *)0x25056a), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_120 = (_Base_ptr)
                std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::begin((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                         *)in_stack_fffffffffffffc98);
    ppVar11 = std::_Rb_tree_iterator<std::pair<const_tiger::trains::world::Point_*const,_int>_>::
              operator->((_Rb_tree_iterator<std::pair<const_tiger::trains::world::Point_*const,_int>_>
                          *)0x250597);
    local_118 = ppVar11->first;
    local_128 = (_Base_ptr)
                std::
                set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                ::begin((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                         *)in_stack_fffffffffffffc98);
    local_130 = (_Base_ptr)
                std::
                set<std::pair<int,tiger::trains::world::Point_const*>,std::less<std::pair<int,tiger::trains::world::Point_const*>>,std::allocator<std::pair<int,tiger::trains::world::Point_const*>>>
                ::erase_abi_cxx11_((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                                    *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                                   in_stack_fffffffffffffca8);
    local_138 = trains::world::Point::getEdges((Point *)0x2505fb);
    local_140._M_current =
         (Line **)std::
                  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                  ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                           *)in_stack_fffffffffffffc98);
    local_148 = (Line **)std::
                         vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                         ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                                *)in_stack_fffffffffffffc98);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                              (__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                               *)in_stack_fffffffffffffc98), bVar2) {
      ppLVar12 = __gnu_cxx::
                 __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                 ::operator*(&local_140);
      local_150 = *ppLVar12;
      local_158 = trains::world::Line::getAnotherPoint(local_150,local_118);
      pmVar10 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[](in_stack_fffffffffffffce0,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      iVar3 = *pmVar10;
      pmVar10 = std::
                map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                ::operator[](in_stack_fffffffffffffce0,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      iVar5 = *pmVar10;
      iVar4 = trains::world::Line::getLenght(local_150);
      if (iVar5 + iVar4 < iVar3) {
        pmVar10 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[](in_stack_fffffffffffffce0,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        std::pair<int,_const_tiger::trains::world::Point_*>::
        pair<int_&,_const_tiger::trains::world::Point_*&,_true>(&local_168,pmVar10,&local_158);
        std::
        set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
        ::erase((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                in_stack_fffffffffffffc98);
        pmVar10 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[](in_stack_fffffffffffffce0,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        iVar3 = *pmVar10;
        iVar5 = trains::world::Line::getLenght(local_150);
        pmVar10 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[](in_stack_fffffffffffffce0,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        *pmVar10 = iVar3 + iVar5;
        pmVar10 = std::
                  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
                  ::operator[](in_stack_fffffffffffffce0,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        std::pair<int,_const_tiger::trains::world::Point_*>::
        pair<int_&,_const_tiger::trains::world::Point_*&,_true>(&local_178,pmVar10,&local_158);
        pVar14 = std::
                 set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                 ::insert((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
                           *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                          in_stack_fffffffffffffcb8);
        local_188 = (_Base_ptr)pVar14.first._M_node;
        local_180 = pVar14.second;
      }
      __gnu_cxx::
      __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
      ::operator++(&local_140);
    }
  }
  trains::world::Train::getPlayer(local_20);
  local_190 = trains::world::Player::getHome((Player *)0x2508fc);
  pWVar7 = trains::world::Train::getWorld(local_20);
  local_198 = trains::world::World::getPostList(pWVar7);
  local_1a0._M_current =
       (IPost **)
       std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
       begin((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
              *)in_stack_fffffffffffffc98);
  std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::end
            ((vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
              *)in_stack_fffffffffffffc98);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                            (__normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
                             *)in_stack_fffffffffffffc98), bVar2) {
    ppIVar13 = __gnu_cxx::
               __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
               ::operator*(&local_1a0);
    pIVar1 = *ppIVar13;
    (*local_190->_vptr_IPost[5])();
    pmVar10 = std::
              map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
              ::operator[](in_stack_fffffffffffffce0,
                           (key_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                          );
    in_stack_fffffffffffffcdc = *pmVar10;
    iVar3 = (*pIVar1->_vptr_IPost[5])();
    in_stack_fffffffffffffce0 =
         (map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
          *)CONCAT44(extraout_var,iVar3);
    pmVar10 = std::
              map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
              ::operator[](in_stack_fffffffffffffce0,
                           (key_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                          );
    if (*pmVar10 < in_stack_fffffffffffffcdc) {
      iVar3 = (*pIVar1->_vptr_IPost[7])();
      if ((iVar3 == 2) && (GVar6 = trains::world::Train::getGoodsType(local_20), GVar6 == PRODUCT))
      {
        local_190 = pIVar1;
      }
      iVar3 = (*pIVar1->_vptr_IPost[7])();
      if ((iVar3 == 3) && (GVar6 = trains::world::Train::getGoodsType(local_20), GVar6 == ARMOR)) {
        local_190 = pIVar1;
      }
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::IPost_*const_*,_std::vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>_>
    ::operator++(&local_1a0);
  }
  (*local_190->_vptr_IPost[5])();
  std::
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::operator[](in_stack_fffffffffffffce0,
               (key_type *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  pVar15 = std::make_pair<tiger::trains::world::IPost*&,int&>
                     ((IPost **)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                      &in_stack_fffffffffffffc98->first);
  local_10 = pVar15.first;
  local_8 = pVar15.second;
  std::
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  ::~set((set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
          *)0x250b8f);
  std::
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::~map((map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
          *)0x250b9c);
  pVar15.second = local_8;
  pVar15.first = local_10;
  pVar15._12_4_ = 0;
  return pVar15;
}

Assistant:

std::pair<world::IPost *, int> TrainGoalPredictor::predictGoal(const world::Train *train)
{
    std::map<const world::Point *, int> minLen;

    for (auto point : train->getWorld()->getPointList())
        minLen[point] = INT_MAX;

    const world::Point *startPoint = train->getLine()->getStartPont();
    int lenToStart = train->getPosition();
    const world::Point *endPoint = train->getLine()->getEndPont();
    int lenToEnd = train->getLine()->getLenght() - train->getPosition();

    minLen[startPoint] = lenToStart;
    minLen[endPoint] = lenToEnd;

    std::set< std::pair<int, const world::Point *>> setMinLen;
    setMinLen.insert({lenToStart, startPoint});
    setMinLen.insert({lenToEnd, endPoint});

    while (!setMinLen.empty())
    {
        auto minPoint = minLen.begin()->first;
        setMinLen.erase(setMinLen.begin());

        for (auto line : minPoint->getEdges())
        {
            const world::Point *another = line->getAnotherPoint(minPoint);

            if (minLen[another] > minLen[minPoint] + line->getLenght())
            {
                setMinLen.erase({minLen[another], another});
                minLen[another] = minLen[minPoint] + line->getLenght();
                setMinLen.insert({minLen[another], another});
            }
        }

    }

    world::IPost *minPost = train->getPlayer()->getHome();

    for (world::IPost *post : train->getWorld()->getPostList())
        if (minLen[minPost->getPoint()] > minLen[post->getPoint()])
        {
            if (post->getPostType() == models::PostType::MARKET && train->getGoodsType() == models::GoodType::PRODUCT)
                minPost = post;

            if (post->getPostType() == models::PostType::STORAGE && train->getGoodsType() == models::GoodType::ARMOR)
                minPost = post;
        }

    return std::make_pair(minPost, minLen[minPost->getPoint()]);
}